

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O0

_Bool borg_cave_floor_grid(borg_grid *ag)

{
  borg_grid *ag_local;
  
  if (((((ag->feat == '\0') || (ag->feat == '\x01')) || (ag->feat == '\x03')) ||
      ((ag->feat == '\x06' || (ag->feat == '\x05')))) ||
     ((ag->feat == '\x04' || ((ag->feat == '\x18' || (ag->feat == '\x17')))))) {
    ag_local._7_1_ = true;
  }
  else {
    ag_local._7_1_ = false;
  }
  return ag_local._7_1_;
}

Assistant:

bool borg_cave_floor_grid(borg_grid *ag)
{
    if (ag->feat == FEAT_NONE || ag->feat == FEAT_FLOOR || ag->feat == FEAT_OPEN
        || ag->feat == FEAT_MORE || ag->feat == FEAT_LESS
        || ag->feat == FEAT_BROKEN || ag->feat == FEAT_PASS_RUBBLE
        || ag->feat == FEAT_LAVA)
        return true;
    return false;
}